

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

ssize_t __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write
          (writer_base<cppwinrt::writer> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  char cVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar3;
  ulong uVar4;
  char cVar5;
  undefined4 in_register_00000034;
  ulong __val;
  string __str;
  long *local_40;
  uint local_38;
  undefined4 uStack_34;
  long local_30 [2];
  
  __val = CONCAT44(in_register_00000034,__fd);
  cVar5 = '\x01';
  if (9 < __val) {
    uVar4 = __val;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (uVar4 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00173aeb;
      }
      if (uVar4 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00173aeb;
      }
      if (uVar4 < 10000) goto LAB_00173aeb;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_00173aeb:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,__val);
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_40,
             (long)local_40 + CONCAT44(uStack_34,local_38));
  sVar3 = extraout_RAX;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
    sVar3 = extraout_RAX_00;
  }
  return sVar3;
}

Assistant:

void write(unsigned long const value)
        {
            write(std::to_string(value));
        }